

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O3

void __thiscall
scApp::scApp(scApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  option my_option_list [31];
  char *local_408;
  undefined4 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  char *local_3e8;
  undefined4 local_3e0;
  undefined8 local_3d8;
  undefined4 local_3d0;
  char *local_3c8;
  undefined4 local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  char *local_3a8;
  undefined4 local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  char *local_388;
  undefined4 local_380;
  undefined8 local_378;
  undefined4 local_370;
  char *local_368;
  undefined4 local_360;
  undefined8 local_358;
  undefined4 local_350;
  char *local_348;
  undefined4 local_340;
  undefined8 local_338;
  undefined4 local_330;
  char *local_328;
  undefined4 local_320;
  undefined8 local_318;
  undefined4 local_310;
  char *local_308;
  undefined4 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  char *local_2e8;
  undefined4 local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  char *local_2c8;
  undefined4 local_2c0;
  undefined8 local_2b8;
  undefined4 local_2b0;
  char *local_2a8;
  undefined4 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  char *local_288;
  undefined4 local_280;
  undefined8 local_278;
  undefined4 local_270;
  char *local_268;
  undefined4 local_260;
  undefined8 local_258;
  undefined4 local_250;
  char *local_248;
  undefined4 local_240;
  undefined8 local_238;
  undefined4 local_230;
  char *local_228;
  undefined4 local_220;
  undefined8 local_218;
  undefined4 local_210;
  char *local_208;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  char *local_1e8;
  undefined4 local_1e0;
  undefined8 local_1d8;
  undefined4 local_1d0;
  char *local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  char *local_1a8;
  undefined4 local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  char *local_188;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_170;
  char *local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_150;
  char *local_148;
  undefined4 local_140;
  undefined8 local_138;
  undefined4 local_130;
  char *local_128;
  undefined4 local_120;
  undefined8 local_118;
  undefined4 local_110;
  char *local_108;
  undefined4 local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  char *local_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  char *local_c8;
  undefined4 local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  char *local_a8;
  undefined4 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  char *local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  char *local_68;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  
  ktxApp::ktxApp(&this->super_ktxApp,version,defaultVersion,&options->super_commandOptions);
  (this->super_ktxApp)._vptr_ktxApp = (_func_int **)&PTR___cxa_pure_virtual_001b2648;
  this->options = options;
  (this->scparamKey)._M_dataplus._M_p = (pointer)&(this->scparamKey).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->scparamKey,"KTXwriterScParams","");
  (this->scparams)._M_dataplus._M_p = (pointer)&(this->scparams).field_2;
  (this->scparams)._M_string_length = 0;
  (this->scparams).field_2._M_local_buf[0] = '\0';
  local_408 = "zcmp";
  local_400 = 2;
  local_3f8 = 0;
  local_3f0 = 0x7a;
  local_3e8 = "no_multithreading";
  local_3e0 = 0;
  local_3d8 = 0;
  local_3d0 = 0x4e;
  local_3c8 = "threads";
  local_3c0 = 1;
  local_3b8 = 0;
  local_3b0 = 0x74;
  local_3a8 = "clevel";
  local_3a0 = 1;
  local_398 = 0;
  local_390 = 99;
  local_388 = "qlevel";
  local_380 = 1;
  local_378 = 0;
  local_370 = 0x71;
  local_368 = "max_endpoints";
  local_360 = 1;
  local_358 = 0;
  local_350 = 0x65;
  local_348 = "endpoint_rdo_threshold";
  local_340 = 1;
  local_338 = 0;
  local_330 = 0x45;
  local_328 = "max_selectors";
  local_320 = 1;
  local_318 = 0;
  local_310 = 0x75;
  local_308 = "selector_rdo_threshold";
  local_300 = 1;
  local_2f8 = 0;
  local_2f0 = 0x53;
  local_2e8 = "normal_mode";
  local_2e0 = 0;
  local_2d8 = 0;
  local_2d0 = 0x6e;
  local_2c8 = "separate_rg_to_color_alpha";
  local_2c0 = 0;
  local_2b8 = 0;
  local_2b0 = 1000;
  local_2a8 = "no_endpoint_rdo";
  local_2a0 = 0;
  local_298 = 0;
  local_290 = 0x3e9;
  local_288 = "no_selector_rdo";
  local_280 = 0;
  local_278 = 0;
  local_270 = 0x3ea;
  local_268 = "no_sse";
  local_260 = 0;
  local_258 = 0;
  local_250 = 0x3f3;
  local_248 = "uastc_quality";
  local_240 = 1;
  local_238 = 0;
  local_230 = 0x3eb;
  local_228 = "uastc_rdo_l";
  local_220 = 2;
  local_218 = 0;
  local_210 = 0x3ec;
  local_208 = "uastc_rdo_d";
  local_200 = 1;
  local_1f8 = 0;
  local_1f0 = 0x3ed;
  local_1e8 = "uastc_rdo_b";
  local_1e0 = 2;
  local_1d8 = 0;
  local_1d0 = 0x3ee;
  local_1c8 = "uastc_rdo_s";
  local_1c0 = 2;
  local_1b8 = 0;
  local_1b0 = 0x3ef;
  local_1a8 = "uastc_rdo_f";
  local_1a0 = 0;
  local_198 = 0;
  local_190 = 0x3f0;
  local_188 = "uastc_rdo_m";
  local_180 = 0;
  local_178 = 0;
  local_170 = 0x3f1;
  local_168 = "verbose";
  local_160 = 0;
  local_158 = 0;
  local_150 = 0x3f2;
  local_148 = "astc_blk_d";
  local_140 = 1;
  local_138 = 0;
  local_130 = 0x3f4;
  local_128 = "astc_mode";
  local_120 = 1;
  local_118 = 0;
  local_110 = 0x3f5;
  local_108 = "astc_quality";
  local_100 = 1;
  local_f8 = 0;
  local_f0 = 0x3f6;
  local_e8 = "astc_perceptual";
  local_e0 = 0;
  local_d8 = 0;
  local_d0 = 0x3f7;
  local_c8 = "encode";
  local_c0 = 1;
  local_b8 = 0;
  local_b0 = 0x3f8;
  local_a8 = "input_swizzle";
  local_a0 = 1;
  local_98 = 0;
  local_90 = 0x44c;
  local_88 = "normalize";
  local_80 = 0;
  local_78 = 0;
  local_70 = 0x3f9;
  local_68 = "bcmp";
  local_60 = 0;
  local_58 = 0;
  local_50 = 0x62;
  local_48 = "uastc";
  local_40 = 2;
  local_38 = 0;
  local_30 = 0x3fa;
  std::vector<argparser::option,std::allocator<argparser::option>>::
  _M_range_insert<argparser::option*>
            ((vector<argparser::option,std::allocator<argparser::option>> *)
             &(this->super_ktxApp).option_list,
             (this->super_ktxApp).option_list.
             super__Vector_base<argparser::option,_std::allocator<argparser::option>_>._M_impl.
             super__Vector_impl_data._M_start,&local_408);
  std::__cxx11::string::append((char *)&(this->super_ktxApp).short_opts);
  return;
}

Assistant:

scApp::scApp(string& version, string& defaultVersion,
             scApp::commandOptions& options)
      : ktxApp(version, defaultVersion, options), options(options)
{
  argparser::option my_option_list[] = {
      { "zcmp", argparser::option::optional_argument, NULL, 'z' },
      { "no_multithreading", argparser::option::no_argument, NULL, 'N' },
      { "threads", argparser::option::required_argument, NULL, 't' },
      { "clevel", argparser::option::required_argument, NULL, 'c' },
      { "qlevel", argparser::option::required_argument, NULL, 'q' },
      { "max_endpoints", argparser::option::required_argument, NULL, 'e' },
      { "endpoint_rdo_threshold", argparser::option::required_argument, NULL, 'E' },
      { "max_selectors", argparser::option::required_argument, NULL, 'u' },
      { "selector_rdo_threshold", argparser::option::required_argument, NULL, 'S' },
      { "normal_mode", argparser::option::no_argument, NULL, 'n' },
      { "separate_rg_to_color_alpha", argparser::option::no_argument, NULL, 1000 },
      { "no_endpoint_rdo", argparser::option::no_argument, NULL, 1001 },
      { "no_selector_rdo", argparser::option::no_argument, NULL, 1002 },
      { "no_sse", argparser::option::no_argument, NULL, 1011 },
      { "uastc_quality", argparser::option::required_argument, NULL, 1003 },
      { "uastc_rdo_l", argparser::option::optional_argument, NULL, 1004 },
      { "uastc_rdo_d", argparser::option::required_argument, NULL, 1005 },
      { "uastc_rdo_b", argparser::option::optional_argument, NULL, 1006 },
      { "uastc_rdo_s", argparser::option::optional_argument, NULL, 1007 },
      { "uastc_rdo_f", argparser::option::no_argument, NULL, 1008 },
      { "uastc_rdo_m", argparser::option::no_argument, NULL, 1009 },
      { "verbose", argparser::option::no_argument, NULL, 1010 },
      { "astc_blk_d", argparser::option::required_argument, NULL, 1012 },
      { "astc_mode", argparser::option::required_argument, NULL, 1013 },
      { "astc_quality", argparser::option::required_argument, NULL, 1014 },
      { "astc_perceptual", argparser::option::no_argument, NULL, 1015 },
      { "encode", argparser::option::required_argument, NULL, 1016 },
      { "input_swizzle", argparser::option::required_argument, NULL, 1100},
      { "normalize", argparser::option::no_argument, NULL, 1017 },
      // Deprecated options
      { "bcmp", argparser::option::no_argument, NULL, 'b' },
      { "uastc", argparser::option::optional_argument, NULL, 1018 }
  };
  const int lastOptionIndex = sizeof(my_option_list)
                              / sizeof(argparser::option);
  option_list.insert(option_list.begin(), my_option_list,
                     my_option_list + lastOptionIndex);
  short_opts += "z;Nt:c:q:e:E:u:S:nb";
}